

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_peers.cpp
# Opt level: O2

observer_ptr __thiscall
libtorrent::dht::get_peers::new_observer(get_peers *this,endpoint *ep,node_id *id)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  observer_ptr oVar3;
  shared_ptr<libtorrent::dht::get_peers_observer> o;
  undefined1 auStack_48 [16];
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  lVar1 = *(long *)((long)&(ep->impl_).data_ + 0x18);
  ::std::__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::dht::traversal_algorithm,void>
            ((__shared_ptr<libtorrent::dht::traversal_algorithm,(__gnu_cxx::_Lock_policy)2> *)
             auStack_48,
             (__weak_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2> *)
             &(ep->impl_).data_.v6.sin6_addr);
  rpc_manager::
  allocate_observer<libtorrent::dht::get_peers_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
            ((rpc_manager *)&stack0xffffffffffffffc8,
             (shared_ptr<libtorrent::dht::traversal_algorithm> *)(lVar1 + 0x170),
             (basic_endpoint<boost::asio::ip::udp> *)auStack_48,id);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  _Var2._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm =
       (_func_int **)local_38;
  (this->super_find_data).super_traversal_algorithm.
  super_enable_shared_from_this<libtorrent::dht::traversal_algorithm>._M_weak_this.
  super___weak_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_pi;
  local_38 = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffd0);
  oVar3.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  oVar3.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (observer_ptr)
         oVar3.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

observer_ptr get_peers::new_observer(udp::endpoint const& ep
	, node_id const& id)
{
	auto o = m_node.m_rpc.allocate_observer<get_peers_observer>(self(), ep, id);
#if TORRENT_USE_ASSERTS
	if (o) o->m_in_constructor = false;
#endif
	return o;
}